

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O0

int lj_cf_newproxy(lua_State *L)

{
  int iVar1;
  undefined4 local_1c;
  int validproxy;
  lua_State *L_local;
  
  lua_settop(L,1);
  lua_newuserdata(L,0);
  iVar1 = lua_toboolean(L,1);
  if (iVar1 != 0) {
    iVar1 = lua_type(L,1);
    if (iVar1 == 1) {
      lua_createtable(L,0,0);
      lua_pushvalue(L,-1);
      lua_pushboolean(L,1);
      lua_rawset(L,-0x2713);
    }
    else {
      local_1c = 0;
      iVar1 = lua_getmetatable(L,1);
      if (iVar1 != 0) {
        lua_rawget(L,-0x2713);
        local_1c = lua_toboolean(L,-1);
        lua_settop(L,-2);
      }
      if (local_1c == 0) {
        lj_err_arg(L,1,LJ_ERR_NOPROXY);
      }
      lua_getmetatable(L,1);
    }
    lua_setmetatable(L,2);
  }
  return 1;
}

Assistant:

LJLIB_CF(newproxy)
{
  lua_settop(L, 1);
  lua_newuserdata(L, 0);
  if (lua_toboolean(L, 1) == 0) {  /* newproxy(): without metatable. */
    return 1;
  } else if (lua_isboolean(L, 1)) {  /* newproxy(true): with metatable. */
    lua_newtable(L);
    lua_pushvalue(L, -1);
    lua_pushboolean(L, 1);
    lua_rawset(L, lua_upvalueindex(1));  /* Remember mt in weak table. */
  } else {  /* newproxy(proxy): inherit metatable. */
    int validproxy = 0;
    if (lua_getmetatable(L, 1)) {
      lua_rawget(L, lua_upvalueindex(1));
      validproxy = lua_toboolean(L, -1);
      lua_pop(L, 1);
    }
    if (!validproxy)
      lj_err_arg(L, 1, LJ_ERR_NOPROXY);
    lua_getmetatable(L, 1);
  }
  lua_setmetatable(L, 2);
  return 1;
}